

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectwriter.cc
# Opt level: O1

Status * google::protobuf::util::converter::ProtoStreamObjectWriter::RenderStructValue
                   (Status *__return_storage_ptr__,ProtoStreamObjectWriter *ow,DataPiece *data)

{
  anon_union_16_8_b72e7a25_for_DataPiece_3 *paVar1;
  StringPiece name;
  char *pcVar2;
  DataPiece *pDVar3;
  StringPiece name_00;
  StringPiece name_01;
  StringPiece name_02;
  StringPiece name_03;
  StringPiece name_04;
  StringPiece name_05;
  StringPiece error_message;
  DataPiece local_f8;
  char *local_c8;
  size_t local_c0;
  char local_b8 [16];
  size_type *local_a8;
  string struct_field_name;
  undefined4 local_80;
  int iStack_7c;
  anon_union_16_8_b72e7a25_for_DataPiece_3 local_78;
  undefined1 local_68;
  undefined1 local_60 [8];
  StatusOr<int> int_value;
  
  local_a8 = &struct_field_name._M_string_length;
  struct_field_name._M_dataplus._M_p = (pointer)0x0;
  struct_field_name._M_string_length._0_1_ = 0;
  switch(data->type_) {
  case TYPE_INT32:
    if ((ow->options_).struct_integers_as_strings == true) {
      pDVar3 = data;
      DataPiece::ToInt32((StatusOr<int> *)local_60,data);
      if (local_60._0_4_ == OK) {
        SimpleDtoa_abi_cxx11_
                  ((string *)((long)&struct_field_name.field_2 + 8),(protobuf *)pDVar3,
                   (double)(int)int_value.status_.error_message_.field_2._8_4_);
        local_f8.field_2.i64_ = struct_field_name.field_2._8_8_;
        if (iStack_7c < 0) {
          StringPiece::LogFatalSizeTooBig(CONCAT44(iStack_7c,local_80),"size_t to int conversion");
        }
        local_f8._vptr_DataPiece = (_func_int **)&PTR__DataPiece_003c8cd8;
        local_f8.type_ = 9;
        local_f8.use_strict_base64_decoding_ = true;
        name_00.length_ = 0xc;
        name_00.ptr_ = "string_value";
        ProtoWriter::RenderDataPiece(&ow->super_ProtoWriter,name_00,&local_f8);
        if ((anon_union_16_8_b72e7a25_for_DataPiece_3 *)struct_field_name.field_2._8_8_ != &local_78
           ) {
          operator_delete((void *)struct_field_name.field_2._8_8_);
        }
        Status::Status(__return_storage_ptr__);
LAB_00327e8e:
        if ((size_type *)int_value.status_._0_8_ !=
            &int_value.status_.error_message_._M_string_length) {
          operator_delete((void *)int_value.status_._0_8_);
        }
        goto LAB_00327db7;
      }
LAB_00327d3a:
      if ((size_type *)int_value.status_._0_8_ != &int_value.status_.error_message_._M_string_length
         ) {
        operator_delete((void *)int_value.status_._0_8_);
      }
    }
    break;
  case TYPE_INT64:
    if ((ow->options_).struct_integers_as_strings == true) {
      DataPiece::ToInt64((StatusOr<long> *)local_60,data);
      if (local_60._0_4_ == OK) {
        paVar1 = &local_f8.field_2;
        local_f8._vptr_DataPiece = (_func_int **)paVar1;
        pcVar2 = FastInt64ToBufferLeft
                           (CONCAT44(int_value.status_.error_message_.field_2._12_4_,
                                     int_value.status_.error_message_.field_2._8_4_),
                            (char *)&paVar1->i32_);
        local_f8._8_8_ = (long)pcVar2 - (long)paVar1;
        local_c8 = local_b8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c8,local_f8._vptr_DataPiece,
                   local_f8._8_8_ + (long)local_f8._vptr_DataPiece);
        local_78.str_.data_ = local_c8;
        if ((long)local_c0 < 0) {
          StringPiece::LogFatalSizeTooBig(local_c0,"size_t to int conversion");
        }
        struct_field_name.field_2._8_8_ = &PTR__DataPiece_003c8cd8;
        local_78.str_.size_ = local_c0;
        local_68 = 1;
        name_03.length_ = 0xc;
        name_03.ptr_ = "string_value";
        ProtoWriter::RenderDataPiece
                  (&ow->super_ProtoWriter,name_03,
                   (DataPiece *)((long)&struct_field_name.field_2 + 8));
        if (local_c8 != local_b8) {
          operator_delete(local_c8);
        }
        Status::Status(__return_storage_ptr__);
        goto LAB_00327e8e;
      }
      goto LAB_00327d3a;
    }
    break;
  case TYPE_UINT32:
    if ((ow->options_).struct_integers_as_strings == true) {
      pDVar3 = data;
      DataPiece::ToUint32((StatusOr<unsigned_int> *)local_60,data);
      if (local_60._0_4_ == OK) {
        SimpleDtoa_abi_cxx11_
                  ((string *)((long)&struct_field_name.field_2 + 8),(protobuf *)pDVar3,
                   (double)(uint)int_value.status_.error_message_.field_2._8_4_);
        local_f8.field_2.i64_ = struct_field_name.field_2._8_8_;
        if (iStack_7c < 0) {
          StringPiece::LogFatalSizeTooBig(CONCAT44(iStack_7c,local_80),"size_t to int conversion");
        }
        local_f8._vptr_DataPiece = (_func_int **)&PTR__DataPiece_003c8cd8;
        local_f8.type_ = 9;
        local_f8.use_strict_base64_decoding_ = true;
        name_01.length_ = 0xc;
        name_01.ptr_ = "string_value";
        ProtoWriter::RenderDataPiece(&ow->super_ProtoWriter,name_01,&local_f8);
        if ((anon_union_16_8_b72e7a25_for_DataPiece_3 *)struct_field_name.field_2._8_8_ != &local_78
           ) {
          operator_delete((void *)struct_field_name.field_2._8_8_);
        }
        Status::Status(__return_storage_ptr__);
        goto LAB_00327e8e;
      }
      goto LAB_00327d3a;
    }
    break;
  case TYPE_UINT64:
    if ((ow->options_).struct_integers_as_strings == true) {
      DataPiece::ToUint64((StatusOr<unsigned_long> *)local_60,data);
      if (local_60._0_4_ == OK) {
        paVar1 = &local_f8.field_2;
        local_f8._vptr_DataPiece = (_func_int **)paVar1;
        pcVar2 = FastUInt64ToBufferLeft
                           (CONCAT44(int_value.status_.error_message_.field_2._12_4_,
                                     int_value.status_.error_message_.field_2._8_4_),
                            (char *)&paVar1->i32_);
        local_f8._8_8_ = (long)pcVar2 - (long)paVar1;
        local_c8 = local_b8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c8,local_f8._vptr_DataPiece,
                   local_f8._8_8_ + (long)local_f8._vptr_DataPiece);
        local_78.str_.data_ = local_c8;
        if ((long)local_c0 < 0) {
          StringPiece::LogFatalSizeTooBig(local_c0,"size_t to int conversion");
        }
        struct_field_name.field_2._8_8_ = &PTR__DataPiece_003c8cd8;
        local_78.str_.size_ = local_c0;
        local_68 = 1;
        name_04.length_ = 0xc;
        name_04.ptr_ = "string_value";
        ProtoWriter::RenderDataPiece
                  (&ow->super_ProtoWriter,name_04,
                   (DataPiece *)((long)&struct_field_name.field_2 + 8));
        if (local_c8 != local_b8) {
          operator_delete(local_c8);
        }
        Status::Status(__return_storage_ptr__);
        goto LAB_00327e8e;
      }
      goto LAB_00327d3a;
    }
    break;
  case TYPE_DOUBLE:
    if ((ow->options_).struct_integers_as_strings == true) {
      pDVar3 = data;
      DataPiece::ToDouble((StatusOr<double> *)local_60,data);
      if (local_60._0_4_ == OK) {
        SimpleDtoa_abi_cxx11_
                  ((string *)((long)&struct_field_name.field_2 + 8),(protobuf *)pDVar3,
                   (double)CONCAT44(int_value.status_.error_message_.field_2._12_4_,
                                    int_value.status_.error_message_.field_2._8_4_));
        local_f8.field_2.i64_ = struct_field_name.field_2._8_8_;
        if (iStack_7c < 0) {
          StringPiece::LogFatalSizeTooBig(CONCAT44(iStack_7c,local_80),"size_t to int conversion");
        }
        local_f8._vptr_DataPiece = (_func_int **)&PTR__DataPiece_003c8cd8;
        local_f8.type_ = 9;
        local_f8.use_strict_base64_decoding_ = true;
        name_05.length_ = 0xc;
        name_05.ptr_ = "string_value";
        ProtoWriter::RenderDataPiece(&ow->super_ProtoWriter,name_05,&local_f8);
        if ((anon_union_16_8_b72e7a25_for_DataPiece_3 *)struct_field_name.field_2._8_8_ != &local_78
           ) {
          operator_delete((void *)struct_field_name.field_2._8_8_);
        }
        Status::Status(__return_storage_ptr__);
        goto LAB_00327e8e;
      }
      goto LAB_00327d3a;
    }
    break;
  case TYPE_FLOAT:
    if ((ow->options_).struct_integers_as_strings == true) {
      pDVar3 = data;
      DataPiece::ToFloat((StatusOr<float> *)local_60,data);
      if (local_60._0_4_ == OK) {
        SimpleDtoa_abi_cxx11_
                  ((string *)((long)&struct_field_name.field_2 + 8),(protobuf *)pDVar3,
                   (double)(float)int_value.status_.error_message_.field_2._8_4_);
        local_f8.field_2.i64_ = struct_field_name.field_2._8_8_;
        if (iStack_7c < 0) {
          StringPiece::LogFatalSizeTooBig(CONCAT44(iStack_7c,local_80),"size_t to int conversion");
        }
        local_f8._vptr_DataPiece = (_func_int **)&PTR__DataPiece_003c8cd8;
        local_f8.type_ = 9;
        local_f8.use_strict_base64_decoding_ = true;
        name_02.length_ = 0xc;
        name_02.ptr_ = "string_value";
        ProtoWriter::RenderDataPiece(&ow->super_ProtoWriter,name_02,&local_f8);
        if ((anon_union_16_8_b72e7a25_for_DataPiece_3 *)struct_field_name.field_2._8_8_ != &local_78
           ) {
          operator_delete((void *)struct_field_name.field_2._8_8_);
        }
        Status::Status(__return_storage_ptr__);
        goto LAB_00327e8e;
      }
      goto LAB_00327d3a;
    }
    break;
  case TYPE_BOOL:
    pcVar2 = "bool_value";
    goto LAB_00327d6b;
  default:
    error_message.length_ = 0x54;
    error_message.ptr_ =
         "Invalid struct data type. Only number, string, boolean or null values are supported.";
    Status::Status(__return_storage_ptr__,INVALID_ARGUMENT,error_message);
    goto LAB_00327db7;
  case TYPE_STRING:
    pcVar2 = "string_value";
    goto LAB_00327d6b;
  case TYPE_NULL:
    pcVar2 = "null_value";
    goto LAB_00327d6b;
  }
  pcVar2 = "number_value";
LAB_00327d6b:
  std::__cxx11::string::_M_replace
            ((ulong)&local_a8,0,struct_field_name._M_dataplus._M_p,(ulong)pcVar2);
  name.length_ = (stringpiece_ssize_type)struct_field_name._M_dataplus._M_p;
  name.ptr_ = (char *)local_a8;
  if ((long)struct_field_name._M_dataplus._M_p < 0) {
    StringPiece::LogFatalSizeTooBig
              ((size_t)struct_field_name._M_dataplus._M_p,"size_t to int conversion");
  }
  ProtoWriter::RenderDataPiece(&ow->super_ProtoWriter,name,data);
  Status::Status(__return_storage_ptr__);
LAB_00327db7:
  if (local_a8 != &struct_field_name._M_string_length) {
    operator_delete(local_a8);
  }
  return __return_storage_ptr__;
}

Assistant:

Status ProtoStreamObjectWriter::RenderStructValue(ProtoStreamObjectWriter* ow,
                                                  const DataPiece& data) {
  std::string struct_field_name;
  switch (data.type()) {
    case DataPiece::TYPE_INT32: {
      if (ow->options_.struct_integers_as_strings) {
        StatusOr<int32> int_value = data.ToInt32();
        if (int_value.ok()) {
          ow->ProtoWriter::RenderDataPiece(
              "string_value",
              DataPiece(SimpleDtoa(int_value.value()), true));
          return Status();
        }
      }
      struct_field_name = "number_value";
      break;
    }
    case DataPiece::TYPE_UINT32: {
      if (ow->options_.struct_integers_as_strings) {
        StatusOr<uint32> int_value = data.ToUint32();
        if (int_value.ok()) {
          ow->ProtoWriter::RenderDataPiece(
              "string_value",
              DataPiece(SimpleDtoa(int_value.value()), true));
          return Status();
        }
      }
      struct_field_name = "number_value";
      break;
    }
    case DataPiece::TYPE_INT64: {
      // If the option to treat integers as strings is set, then render them as
      // strings. Otherwise, fallback to rendering them as double.
      if (ow->options_.struct_integers_as_strings) {
        StatusOr<int64> int_value = data.ToInt64();
        if (int_value.ok()) {
          ow->ProtoWriter::RenderDataPiece(
              "string_value", DataPiece(StrCat(int_value.value()), true));
          return Status();
        }
      }
      struct_field_name = "number_value";
      break;
    }
    case DataPiece::TYPE_UINT64: {
      // If the option to treat integers as strings is set, then render them as
      // strings. Otherwise, fallback to rendering them as double.
      if (ow->options_.struct_integers_as_strings) {
        StatusOr<uint64> int_value = data.ToUint64();
        if (int_value.ok()) {
          ow->ProtoWriter::RenderDataPiece(
              "string_value", DataPiece(StrCat(int_value.value()), true));
          return Status();
        }
      }
      struct_field_name = "number_value";
      break;
    }
    case DataPiece::TYPE_FLOAT: {
      if (ow->options_.struct_integers_as_strings) {
        StatusOr<float> float_value = data.ToFloat();
        if (float_value.ok()) {
          ow->ProtoWriter::RenderDataPiece(
              "string_value",
              DataPiece(SimpleDtoa(float_value.value()), true));
          return Status();
        }
      }
      struct_field_name = "number_value";
      break;
    }
    case DataPiece::TYPE_DOUBLE: {
      if (ow->options_.struct_integers_as_strings) {
        StatusOr<double> double_value = data.ToDouble();
        if (double_value.ok()) {
          ow->ProtoWriter::RenderDataPiece(
              "string_value",
              DataPiece(SimpleDtoa(double_value.value()), true));
          return Status();
        }
      }
      struct_field_name = "number_value";
      break;
    }
    case DataPiece::TYPE_STRING: {
      struct_field_name = "string_value";
      break;
    }
    case DataPiece::TYPE_BOOL: {
      struct_field_name = "bool_value";
      break;
    }
    case DataPiece::TYPE_NULL: {
      struct_field_name = "null_value";
      break;
    }
    default: {
      return Status(util::error::INVALID_ARGUMENT,
                    "Invalid struct data type. Only number, string, boolean or "
                    "null values are supported.");
    }
  }
  ow->ProtoWriter::RenderDataPiece(struct_field_name, data);
  return Status();
}